

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O3

void license::LicenseGenerator::generateAndOutputLicenses(variables_map *vm,ostream *outputFile)

{
  pointer *__ptr;
  pointer this;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfo;
  string license;
  string signature;
  char pkey [888];
  long *local_408;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_400;
  string local_3e8;
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [888];
  
  parseLicenseInfo(&local_400,vm);
  CryptoHelper::getInstance();
  memcpy(local_3a8,
         "-----BEGIN RSA PRIVATE KEY-----\nMIICXAIBAAKBgQC6Ma6fLNc62+xh6SLkQW+20s/baBmfnUbTGVpzD/kH5C3kTljN\nTXWa0nQK3aW5Uc2l8OcHGq08WDiOU1T9gQVpLFbYeKgyrPmi1GK4p3/ivqLuc5hD\nRe+mQAGM8PrFcxtJRnVtEYEGe+7gndg3dq5Uw6nMbc42nzLSnaeKCsCG8QIDAQAB\nAoGAHO+lrLUiSdJt3RWHR6PnwajnhriZ6tVdcWcqSGF+GTzb6PRIFrfoBASa5ilm\nHPPamuRicxcxPwSS3YOT3MXVWiuwzO6qqD9dzvpykEVJSBEN9e/oHuhFAa+nwhXR\nCCvDtGrKsKkW1/YtVJll9jpuj1wZqqWT9nfzYtAAdD1HFRUCQQD0TaZE/Pz7U1jp\n+kKAZ24gXLea5qeZ1sKSzV8QSvJ+GXT4JYWhlV9Uq9TXb+bWVjubU67RJYossUnn\nqtaTc7gzAkEAwxvOM/sQ2G50icaGF5LHWq+BRkfrip6b0vh3B/65H5bGV++mmCyT\nS9Nzw+4eMhULFyskJBIp/7Flo0esNXAwSwJAVbvWSMmbojtqrZnUsqkZfaPsDyE4\n2gUC/W+zF82lcdlPMjJAxibccKNoqz4q/Tb/7g+c/uq0peCFthY+/ToT/wJBAITF\niT9KXR5LnDadyGaGVe9ae4iOLLW6VaPtvWLNbsEWY4c36JCp1NrG3IK6qgW+2Ds9\n+mwpiDceS2Ifxgrfe50CQB3Zbu33Xe4p8ly+0bJe9/afG55OCJERBFjH4Ihpxgyf\nyq8J0/9070I9psBVAzY6OSXRV+a+jurnkXmf9XvzFPk=\n-----END RSA PRIVATE KEY-----\n"
         ,0x378);
  if (local_400.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_400.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this = local_400.
           super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
    do {
      FullLicenseInfo::printForSign_abi_cxx11_(&local_3e8,this);
      (**(code **)(*local_408 + 0x18))(local_3c8,local_408,local_3a8,0x378,&local_3e8);
      std::__cxx11::string::_M_assign((string *)&this->license_signature);
      FullLicenseInfo::printAsIni(this,outputFile);
      if (local_3c8[0] != local_3b8) {
        operator_delete(local_3c8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      this = this + 1;
    } while (this != local_400.
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_408 != (long *)0x0) {
    (**(code **)(*local_408 + 0x28))();
  }
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&local_400);
  return;
}

Assistant:

void LicenseGenerator::generateAndOutputLicenses(const po::variables_map& vm,
		ostream& outputFile) {
	vector<FullLicenseInfo> licenseInfo = parseLicenseInfo(vm);
	unique_ptr<CryptoHelper> helper = CryptoHelper::getInstance();
	const char pkey[] = PRIVATE_KEY;
	size_t len = sizeof(pkey);
	for (auto it = licenseInfo.begin(); it != licenseInfo.end(); ++it) {
		const string license = it->printForSign();
		string signature = helper->signString((const void *)pkey,len,license);
		it->license_signature = signature;
		it->printAsIni(outputFile);
	}
}